

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O0

RotationX<std::complex<double>_> *
qclab::qgates::operator/
          (RotationX<std::complex<double>_> *__return_storage_ptr__,
          RotationX<std::complex<double>_> *lhs,RotationX<std::complex<double>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationX<std::complex<double>_> *rhs_local;
  RotationX<std::complex<double>_> *lhs_local;
  
  iVar1 = QGate1<std::complex<double>_>::qubit((QGate1<std::complex<double>_> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationX<std::complex<double>_>::operator/=(lhs,rhs);
    RotationX<std::complex<double>_>::RotationX(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationX.hpp"
                ,0xba,"RotationX<T> qclab::qgates::operator/(RotationX<T>, const RotationX<T> &)");
}

Assistant:

RotationX< T > operator/( RotationX< T > lhs ,
                                         const RotationX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }